

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatypes.hpp
# Opt level: O2

MPI_Datatype
mxx::datatype_builder<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>::get_type(void)

{
  _Rb_tree_header *p_Var1;
  size_t i;
  long lVar2;
  _Base_ptr p_Var3;
  MPI_Datatype struct_type;
  MPI_Datatype _type;
  int blocklen [3];
  map<long,_ompi_datatype_t_*,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
  members;
  array<ompi_datatype_t_*,_3UL> mpitypes;
  array<long,_3UL> displs;
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    blocklen[lVar2] = 1;
  }
  p_Var1 = &members._M_t._M_impl.super__Rb_tree_header;
  members._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  members._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  members._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  members._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  members._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  tuple_members<3UL,_3UL,_unsigned_long,_unsigned_long,_unsigned_long>::get(&members);
  lVar2 = 0;
  p_Var3 = members._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != p_Var1) {
    *(undefined8 *)((long)displs._M_elems + lVar2) = *(undefined8 *)(p_Var3 + 1);
    *(_Base_ptr *)((long)mpitypes._M_elems + lVar2) = p_Var3[1]._M_parent;
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    lVar2 = lVar2 + 8;
  }
  MPI_Type_create_struct(3,blocklen,&displs,&mpitypes,&struct_type);
  MPI_Type_create_resized(struct_type,0,0x18,&_type);
  MPI_Type_commit(&_type);
  MPI_Type_free(&struct_type);
  std::
  _Rb_tree<long,_std::pair<const_long,_ompi_datatype_t_*>,_std::_Select1st<std::pair<const_long,_ompi_datatype_t_*>_>,_std::less<long>,_std::allocator<std::pair<const_long,_ompi_datatype_t_*>_>_>
  ::~_Rb_tree(&members._M_t);
  return _type;
}

Assistant:

static MPI_Datatype get_type() {
        MPI_Datatype _type;
        // fill in the block lengths to 1 each
        int blocklen[size];
        for (std::size_t i = 0; i < size; ++i) {
            blocklen[i] = 1;
        }

        // get the member displacement and type info for the tuple using
        // meta-recursion
        std::map<MPI_Aint, MPI_Datatype> members;
        tuple_members<size,size,Types...>::get(members);


        // fill displacements and types according to in-memory order in tuple
        // NOTE: the in-memory order is not necessarily the same as the order
        // of types as accessed by std::get
        // For gcc the order is actually reversed!
        // Hence, we use a std::map to collect the order information prior
        // to creating the displacement and type arrays
        std::array<MPI_Aint, size> displs;
        std::array<MPI_Datatype, size> mpitypes;
        std::size_t i = 0;
        for (std::map<MPI_Aint, MPI_Datatype>::iterator it = members.begin();
             it != members.end(); ++it) {
            displs[i] = it->first;
            mpitypes[i] = it->second;
            ++i;
        }

        // create type
        MPI_Datatype struct_type;
        MPI_Type_create_struct(size, blocklen, &displs[0], &mpitypes[0], &struct_type);
        MPI_Type_create_resized(struct_type, 0, sizeof(tuple_t), &_type);
        MPI_Type_commit(&_type);
        MPI_Type_free(&struct_type);

        return _type;
    }